

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O0

DependenceGraph * __thiscall dg::llvmdg::SDGBuilder::getOrCreateDG(SDGBuilder *this,Function *F)

{
  DependenceGraph *g_00;
  SystemDependenceGraph *in_RDI;
  DependenceGraph *g;
  DependenceGraph *dg;
  string *in_stack_ffffffffffffff88;
  Function *in_stack_ffffffffffffffa8;
  SystemDependenceGraph *in_stack_ffffffffffffffb0;
  StringRef *in_stack_ffffffffffffffb8;
  DependenceGraph *local_8;
  
  local_8 = SystemDependenceGraph::getDG(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_8 == (DependenceGraph *)0x0) {
    g_00 = (DependenceGraph *)SystemDependenceGraph::getSDG(*(SystemDependenceGraph **)in_RDI);
    llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffffb8);
    local_8 = sdg::SystemDependenceGraph::createGraph
                        ((SystemDependenceGraph *)g_00,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    SystemDependenceGraph::addFunMapping(in_RDI,(Function *)local_8,g_00);
  }
  return local_8;
}

Assistant:

sdg::DependenceGraph &getOrCreateDG(llvm::Function *F) {
        auto *dg = _llvmsdg->getDG(F);
        if (!dg) {
            auto &g = _llvmsdg->getSDG().createGraph(F->getName().str());
            _llvmsdg->addFunMapping(F, &g);
            return g;
        }

        return *dg;
    }